

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureFilterMinmaxUtils::SupportedTextureType::renderToFBO
          (SupportedTextureType *this,RenderContext *context,GLuint resultTextureId,IVec2 *size,
          GLint reductionMode)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 *puVar4;
  GLuint fbo;
  SupportedTextureType *local_38;
  long lVar3;
  
  local_38 = this;
  iVar1 = (*context->_vptr_RenderContext[3])(context);
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0xb8))(0xde1,resultTextureId);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x88);
  (**(code **)(lVar3 + 0x1380))(0xde1,1,0x8058,size->m_data[0],size->m_data[1]);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glTexStorage2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x8b);
  fbo = 0;
  (**(code **)(lVar3 + 0x6d0))(1,&fbo);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"genFramebuffers error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x8f);
  (**(code **)(lVar3 + 0x78))(0x8d40,fbo);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"bindFramebuffer error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x92);
  (**(code **)(lVar3 + 0x6a0))(0x8d40,0x8ce0,0xde1,resultTextureId,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"framebufferTexture2D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x95);
  iVar1 = (**(code **)(lVar3 + 0x170))(0x8d40);
  if (iVar1 == 0x8cd5) {
    (**(code **)(lVar3 + 0x1a00))(0,0,size->m_data[0],size->m_data[1]);
    renderQuad(local_38,context,reductionMode);
    (**(code **)(lVar3 + 0x440))(1,&fbo);
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

void TextureFilterMinmaxUtils::SupportedTextureType::renderToFBO(const glu::RenderContext& context,
																 glw::GLuint resultTextureId, tcu::IVec2 size,
																 glw::GLint reductionMode)
{
	const glw::Functions& gl = context.getFunctions();

	gl.bindTexture(GL_TEXTURE_2D, resultTextureId);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, size.x(), size.y());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

	glw::GLuint fbo = 0;
	gl.genFramebuffers(1, &fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "genFramebuffers error occurred");

	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bindFramebuffer error occurred");

	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, resultTextureId, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "framebufferTexture2D error occurred");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	gl.viewport(0, 0, size.x(), size.y());
	renderQuad(context, reductionMode);

	gl.deleteFramebuffers(1, &fbo);
}